

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

LY_ERR lys_identity_iffeature_value(lysc_ident *ident)

{
  lysp_ident *plVar1;
  lysp_include *plVar2;
  ulong local_80;
  ulong local_70;
  ulong local_60;
  LY_ERR ret__;
  lysp_include *includes;
  lysp_ident *found_ident;
  lysp_ident *idents_p;
  ulong uStack_28;
  ly_bool enabled;
  uint64_t v;
  uint64_t u;
  lysc_ident *ident_local;
  
  includes = (lysp_include *)0x0;
  u = (uint64_t)ident;
  if (ident == (lysc_ident *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ident",
           "lys_identity_iffeature_value");
    ident_local._4_4_ = LY_EINVAL;
  }
  else if (ident->module->parsed == (lysp_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ident->module->parsed",
           "lys_identity_iffeature_value");
    ident_local._4_4_ = LY_EINVAL;
  }
  else {
    plVar1 = ident->module->parsed->identities;
    v = 0;
    while( true ) {
      if (plVar1 == (lysp_ident *)0x0) {
        local_60 = 0;
      }
      else {
        local_60 = *(ulong *)&plVar1[-1].flags;
      }
      if (local_60 <= v) goto LAB_0018752b;
      if (plVar1[v].name == ident->name) break;
      v = v + 1;
    }
    includes = (lysp_include *)(plVar1 + v);
LAB_0018752b:
    if (includes == (lysp_include *)0x0) {
      plVar2 = ident->module->parsed->includes;
      v = 0;
      while( true ) {
        if (plVar2 == (lysp_include *)0x0) {
          local_70 = 0;
        }
        else {
          local_70 = *(ulong *)(plVar2[-1].rev + 8);
        }
        if (local_70 <= v) break;
        plVar1 = (plVar2[v].submodule)->identities;
        uStack_28 = 0;
        while( true ) {
          if (plVar1 == (lysp_ident *)0x0) {
            local_80 = 0;
          }
          else {
            local_80 = *(ulong *)&plVar1[-1].flags;
          }
          if (local_80 <= uStack_28) goto LAB_00187613;
          if (plVar1[uStack_28].name == ident->name) break;
          uStack_28 = uStack_28 + 1;
        }
        includes = (lysp_include *)(plVar1 + uStack_28);
LAB_00187613:
        v = v + 1;
      }
    }
    if (includes == (lysp_include *)0x0) {
      __assert_fail("found_ident",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                    ,0x85,"LY_ERR lys_identity_iffeature_value(const struct lysc_ident *)");
    }
    ident_local._4_4_ =
         lys_eval_iffeatures(ident->module->ctx,(lysp_qname *)includes->name,
                             (ly_bool *)((long)&idents_p + 7));
    if (ident_local._4_4_ == LY_SUCCESS) {
      if (idents_p._7_1_ == '\0') {
        ident_local._4_4_ = LY_ENOT;
      }
      else {
        ident_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return ident_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_identity_iffeature_value(const struct lysc_ident *ident)
{
    LY_ARRAY_COUNT_TYPE u, v;
    ly_bool enabled;
    const struct lysp_ident *idents_p, *found_ident = NULL;
    struct lysp_include *includes;

    LY_CHECK_ARG_RET(NULL, ident, ident->module->parsed, LY_EINVAL);

    /* Search parsed identity in the module. */
    idents_p = ident->module->parsed->identities;
    LY_ARRAY_FOR(idents_p, u) {
        if (idents_p[u].name == ident->name) {
            found_ident = &idents_p[u];
            break;
        }
    }

    if (!found_ident) {
        /* It is not in the module, so it must be in some submodule. */
        includes = ident->module->parsed->includes;
        LY_ARRAY_FOR(includes, u) {
            idents_p = includes[u].submodule->identities;
            LY_ARRAY_FOR(idents_p, v) {
                if (idents_p[v].name == ident->name) {
                    found_ident = &idents_p[v];
                    break;
                }
            }
        }
    }

    assert(found_ident);

    /* Evaluate its if-feature. */
    LY_CHECK_RET(lys_eval_iffeatures(ident->module->ctx, found_ident->iffeatures, &enabled));
    if (!enabled) {
        return LY_ENOT;
    }

    return LY_SUCCESS;
}